

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

char * Acb_RemapOneFunction(char *pStr,Vec_Int_t *vSupp,Vec_Int_t *vMap,int nVars)

{
  char cVar1;
  uint uVar2;
  Vec_Str_t *p;
  char *pcVar3;
  char *__ptr;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pArray;
  size_t __size;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar3 = (char *)malloc(100);
  p->pArray = pcVar3;
  pcVar3 = strtok(pStr,"\n");
  if (pcVar3 != (char *)0x0) {
LAB_00375033:
    if (0 < nVars) {
      lVar6 = (long)p->nSize;
      uVar5 = p->nCap;
      __ptr = p->pArray;
      iVar4 = nVars;
      do {
        if ((uint)lVar6 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (__ptr == (char *)0x0) {
              __ptr = (char *)malloc(0x10);
            }
            else {
              __ptr = (char *)realloc(__ptr,0x10);
            }
            uVar5 = 0x10;
          }
          else {
            uVar2 = uVar5 * 2;
            if (SBORROW4(uVar5,uVar2) != 0 < (int)uVar5) {
              uVar5 = uVar2;
              if (__ptr == (char *)0x0) {
                __ptr = (char *)malloc((ulong)uVar2);
              }
              else {
                __ptr = (char *)realloc(__ptr,(ulong)uVar2);
              }
            }
          }
        }
        __ptr[lVar6] = '-';
        lVar6 = lVar6 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      p->nSize = (int)lVar6;
      p->nCap = uVar5;
      p->pArray = __ptr;
    }
    lVar6 = 0;
    do {
      cVar1 = pcVar3[lVar6];
      if (cVar1 != '-') {
        if (cVar1 == ' ') goto LAB_00375133;
        if (vSupp->nSize <= lVar6) {
LAB_00375216:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = vSupp->pArray[lVar6];
        if (((long)iVar4 < 0) || (vMap->nSize <= iVar4)) goto LAB_00375216;
        iVar4 = vMap->pArray[iVar4];
        if ((iVar4 < 0) || (nVars <= iVar4)) {
          __assert_fail("iVar >= 0 && iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x8b0,"char *Acb_RemapOneFunction(char *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        uVar5 = (p->nSize - nVars) + iVar4;
        if (((int)uVar5 < 0) || (p->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        p->pArray[uVar5] = cVar1;
      }
      lVar6 = lVar6 + 1;
    } while( true );
  }
LAB_00375168:
  uVar5 = p->nSize;
  uVar2 = p->nCap;
  if (uVar5 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar2 * 2;
      if ((int)__size <= (int)uVar2) goto LAB_003751c6;
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,__size);
      }
    }
    p->pArray = pcVar3;
    p->nCap = (int)__size;
  }
LAB_003751c6:
  pcVar3 = p->pArray;
  p->nSize = uVar5 + 1;
  pcVar3[(int)uVar5] = '\0';
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (char *)0x0;
  if (p->pArray != (char *)0x0) {
    free(p->pArray);
    p->pArray = (char *)0x0;
  }
  free(p);
  return pcVar3;
LAB_00375133:
  Vec_StrPrintF(p," %d\n",(ulong)((int)pcVar3[(int)lVar6 + 1] - 0x30));
  pcVar3 = strtok((char *)0x0,"\n");
  if (pcVar3 == (char *)0x0) goto LAB_00375168;
  goto LAB_00375033;
}

Assistant:

char * Acb_RemapOneFunction( char * pStr, Vec_Int_t * vSupp, Vec_Int_t * vMap, int nVars )
{
    Vec_Str_t * vTempSop = Vec_StrAlloc( 100 );
    char * pToken = strtok( pStr, "\n" );  int i; 
    while ( pToken != NULL )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vTempSop, '-' );
        for ( i = 0; pToken[i] != ' '; i++ )
            if ( pToken[i] != '-' )
            {
                int iVar = Vec_IntEntry( vMap, Vec_IntEntry(vSupp, i) );
                assert( iVar >= 0 && iVar < nVars );
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - nVars + iVar, pToken[i] );
            }
        Vec_StrPrintF( vTempSop, " %d\n", pToken[i+1] - '0' );
        pToken = strtok( NULL, "\n" );
    }
    Vec_StrPush( vTempSop, '\0' );
    pToken = Vec_StrReleaseArray(vTempSop);
    Vec_StrFree( vTempSop );
    return pToken;
}